

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlDocPtr xmlReadMemory(char *buffer,int size,char *url,char *encoding,int options)

{
  xmlParserCtxtPtr ctxt;
  xmlParserInputPtr input;
  xmlDocPtr pxVar1;
  
  if (-1 < size) {
    ctxt = xmlNewParserCtxt();
    if (ctxt != (xmlParserCtxtPtr)0x0) {
      xmlCtxtUseOptions(ctxt,options);
      input = xmlCtxtNewInputFromMemory
                        (ctxt,url,buffer,(ulong)(uint)size,encoding,XML_INPUT_BUF_STATIC);
      if (input == (xmlParserInputPtr)0x0) {
        pxVar1 = (xmlDocPtr)0x0;
      }
      else {
        pxVar1 = xmlCtxtParseDocument(ctxt,input);
      }
      xmlFreeParserCtxt(ctxt);
      return pxVar1;
    }
  }
  return (xmlDocPtr)0x0;
}

Assistant:

xmlDocPtr
xmlReadMemory(const char *buffer, int size, const char *url,
              const char *encoding, int options)
{
    xmlParserCtxtPtr ctxt;
    xmlParserInputPtr input;
    xmlDocPtr doc = NULL;

    if (size < 0)
	return(NULL);

    ctxt = xmlNewParserCtxt();
    if (ctxt == NULL)
        return(NULL);

    xmlCtxtUseOptions(ctxt, options);

    input = xmlCtxtNewInputFromMemory(ctxt, url, buffer, size, encoding,
                                      XML_INPUT_BUF_STATIC);

    if (input != NULL)
        doc = xmlCtxtParseDocument(ctxt, input);

    xmlFreeParserCtxt(ctxt);
    return(doc);
}